

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void alloc_free(void *ptr)

{
  long lVar1;
  void *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != (void *)0x0) {
    free(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void
alloc_free(void* ptr)
{
  if (ptr == NULL) {
#ifdef DEBUG
    /* catch NULL pointers passed to frees in debug mode */
    PANIC(__FUNCTION__, __FILE__, __LINE__);
#else
    /* if we are not in debug mode this case will be ignored for stability */
    return;
#endif /* DEBUG */
  }
  free(ptr);
}